

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O0

TestStatus * __thiscall
vkt::texture::anon_unknown_0::TextureCubeMipmapTestInstance::iterate
          (TestStatus *__return_storage_ptr__,TextureCubeMipmapTestInstance *this)

{
  int iVar1;
  int iVar2;
  int height;
  deUint32 width;
  int iVar3;
  int iVar4;
  size_type sVar5;
  reference pvVar6;
  int *piVar7;
  reference pvVar8;
  TestTextureCube *pTVar9;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  TestContext *pTVar10;
  qpWatchDog *watchDog;
  TestLog *pTVar11;
  MessageBuilder *pMVar12;
  allocator<char> local_939;
  string local_938;
  byte local_913;
  byte local_912;
  allocator<char> local_911;
  string local_910;
  undefined1 local_8ea;
  allocator<char> local_8e9;
  undefined1 local_8e8 [6];
  bool isOk;
  allocator<char> local_8c1;
  string local_8c0;
  LogImage local_8a0;
  allocator<char> local_809;
  string local_808;
  allocator<char> local_7e1;
  string local_7e0;
  LogImage local_7c0;
  allocator<char> local_729;
  string local_728;
  allocator<char> local_701;
  string local_700;
  LogImage local_6e0;
  allocator<char> local_649;
  string local_648;
  allocator<char> local_621;
  string local_620;
  LogImageSet local_600;
  MessageBuilder local_5c0;
  TextureCubeView local_440;
  PixelBufferAccess local_408;
  PixelBufferAccess local_3e0;
  PixelBufferAccess local_3b8;
  ConstPixelBufferAccess local_390;
  PixelBufferAccess local_368;
  ConstPixelBufferAccess local_340;
  TextureCubeView local_318;
  undefined1 local_2e0 [8];
  SurfaceAccess idealDst;
  CubeFace cubeFace_1;
  int curH_1;
  int curW_1;
  int curY_1;
  int curX_1;
  int cellNdx_1;
  int local_29c;
  Vector<int,_3> local_298;
  Vector<int,_4> local_28c;
  Vector<int,_4> local_27c;
  Vector<int,_4> local_26c;
  IVec4 local_25c;
  tcu local_24c [8];
  float local_244 [2];
  float local_23c;
  Sampler local_238;
  undefined1 local_1fc [8];
  LodPrecision lodPrec;
  LookupPrecision lookupPrec;
  int numFailedPixels;
  Surface errorMask;
  Surface referenceFrame;
  PixelFormat pixelFormat;
  undefined1 local_178 [8];
  IVec4 formatBitDepth;
  CubeFace cubeFace;
  float curH;
  float curW;
  float curY;
  float curX;
  int cellNdx;
  vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> gridLayout;
  Sampler local_130;
  undefined1 local_e8 [8];
  Surface renderedFrame;
  vector<float,_std::allocator<float>_> texCoord;
  ReferenceParams refParams;
  bool useLodBias;
  bool isProjected;
  int viewportHeight;
  int viewportWidth;
  TextureCubeMipmapTestInstance *this_local;
  
  width = util::TextureRenderer::getRenderWidth(&this->m_renderer);
  refParams.maxLevel = util::TextureRenderer::getRenderHeight(&this->m_renderer);
  refParams.baseLevel._3_1_ =
       (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.coordType ==
       COORDTYPE_PROJECTED;
  refParams.baseLevel._2_1_ =
       (this->m_testParameters).super_TextureMipmapCommonTestCaseParameters.coordType ==
       COORDTYPE_BASIC_BIAS;
  glu::TextureTestUtil::ReferenceParams::ReferenceParams
            ((ReferenceParams *)
             &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,TEXTURETYPE_CUBE);
  std::vector<float,_std::allocator<float>_>::vector
            ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap);
  tcu::Surface::Surface((Surface *)local_e8,width,refParams.maxLevel);
  util::createSampler(&local_130,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
  tcu::Sampler::operator=((Sampler *)(refParams.super_RenderParams.colorBias.m_data + 2),&local_130)
  ;
  gridLayout.super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (pointer)::vk::mapVkFormat((this->m_testParameters).super_TextureCubeTestCaseParameters.
                                  super_TextureCommonTestCaseParameters.format);
  texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ =
       glu::TextureTestUtil::getSamplerType
                 ((TextureFormat)
                  gridLayout.
                  super__Vector_base<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage);
  refParams.super_RenderParams.texType =
       (refParams.baseLevel._3_1_ & 1) + (refParams.baseLevel._2_1_ & 1) * 2;
  refParams.sampler.seamlessCubeMap = false;
  refParams.sampler._53_3_ = 0;
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX);
  computeGridLayout((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX,
                    width,refParams.maxLevel);
  if ((texture::(anonymous_namespace)::TextureCubeMipmapTestInstance::iterate()::s_projections ==
       '\0') &&
     (iVar3 = __cxa_guard_acquire(&texture::(anonymous_namespace)::TextureCubeMipmapTestInstance::
                                   iterate()::s_projections), iVar3 != 0)) {
    tcu::Vector<float,_4>::Vector(iterate::s_projections,1.2,1.0,0.7,1.0);
    tcu::Vector<float,_4>::Vector(iterate::s_projections + 1,1.3,0.8,0.6,1.1);
    tcu::Vector<float,_4>::Vector(iterate::s_projections + 2,0.8,1.0,1.2,0.8);
    tcu::Vector<float,_4>::Vector(iterate::s_projections + 3,1.2,1.0,1.3,0.9);
    __cxa_guard_release(&texture::(anonymous_namespace)::TextureCubeMipmapTestInstance::iterate()::
                         s_projections);
  }
  for (curY = 0.0;
      sVar5 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::size
                        ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX
                        ), (int)curY < (int)sVar5; curY = (float)((int)curY + 1)) {
    pvVar6 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX,
                        (long)(int)curY);
    piVar7 = tcu::Vector<int,_4>::x(pvVar6);
    iVar3 = *piVar7;
    pvVar6 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX,
                        (long)(int)curY);
    piVar7 = tcu::Vector<int,_4>::y(pvVar6);
    iVar1 = *piVar7;
    pvVar6 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX,
                        (long)(int)curY);
    piVar7 = tcu::Vector<int,_4>::z(pvVar6);
    iVar2 = *piVar7;
    pvVar6 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX,
                        (long)(int)curY);
    piVar7 = tcu::Vector<int,_4>::w(pvVar6);
    formatBitDepth.m_data[3] = (int)(float)*piVar7;
    formatBitDepth.m_data[2] = (int)curY % 6;
    glu::TextureTestUtil::computeQuadTexCoordCube
              ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,
               formatBitDepth.m_data[2]);
    if ((refParams.baseLevel._3_1_ & 1) != 0) {
      refParams.super_RenderParams.texType = refParams.super_RenderParams.texType | TEXTURETYPE_CUBE
      ;
      refParams.super_RenderParams.samplerType =
           (SamplerType)iterate::s_projections[(int)curY % 4].m_data[0];
      refParams.super_RenderParams.flags = (deUint32)iterate::s_projections[(int)curY % 4].m_data[1]
      ;
      refParams.super_RenderParams.w.m_data._0_8_ =
           *(undefined8 *)(iterate::s_projections[(int)curY % 4].m_data + 2);
    }
    if ((refParams.baseLevel._2_1_ & 1) != 0) {
      refParams.super_RenderParams.texType =
           refParams.super_RenderParams.texType | TEXTURETYPE_2D_ARRAY;
      refParams.super_RenderParams.w.m_data[2] = iterate::s_bias[(int)curY % 8];
    }
    util::TextureRenderer::setViewport
              (&this->m_renderer,(float)iVar3,(float)iVar1,(float)iVar2,
               (float)formatBitDepth.m_data[3]);
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,0);
    util::TextureRenderer::renderQuad
              (&this->m_renderer,(Surface *)local_e8,0,pvVar8,
               (ReferenceParams *)
               &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  pixelFormat._8_8_ = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatBitDepth((tcu *)local_178,(TextureFormat *)&pixelFormat.blueBits);
  piVar7 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_178,0);
  iVar3 = *piVar7;
  piVar7 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_178,1);
  iVar1 = *piVar7;
  piVar7 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_178,2);
  iVar2 = *piVar7;
  piVar7 = tcu::Vector<int,_4>::operator[]((Vector<int,_4> *)local_178,3);
  tcu::PixelFormat::PixelFormat
            ((PixelFormat *)&referenceFrame.m_pixels.m_cap,iVar3,iVar1,iVar2,*piVar7);
  tcu::Surface::Surface((Surface *)&errorMask.m_pixels.m_cap,width,refParams.maxLevel);
  tcu::Surface::Surface((Surface *)&lookupPrec.colorMask,width,refParams.maxLevel);
  lookupPrec.colorThreshold.m_data[3] = 0.0;
  tcu::LookupPrecision::LookupPrecision((LookupPrecision *)&lodPrec.derivateBits);
  tcu::LodPrecision::LodPrecision((LodPrecision *)local_1fc,RULE_VULKAN);
  util::createSampler(&local_238,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapS,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.wrapT,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.minFilter,
                      (this->m_testParameters).super_TextureCubeTestCaseParameters.
                      super_TextureCommonTestCaseParameters.magFilter);
  tcu::Sampler::operator=((Sampler *)(refParams.super_RenderParams.colorBias.m_data + 2),&local_238)
  ;
  refParams.sampler.borderColor.v.uData[2]._0_1_ = 1;
  refParams.sampler.seamlessCubeMap = false;
  refParams.sampler._53_3_ = 0;
  glu::TextureTestUtil::getCompareMask
            ((TextureTestUtil *)&local_23c,(PixelFormat *)&referenceFrame.m_pixels.m_cap);
  lookupPrec.colorThreshold.m_data[2] = local_23c;
  glu::TextureTestUtil::getBitsVec
            ((TextureTestUtil *)&local_27c,(PixelFormat *)&referenceFrame.m_pixels.m_cap);
  tcu::operator-((tcu *)&local_26c,&local_27c,2);
  tcu::Vector<int,_4>::Vector(&local_28c,0);
  tcu::max<int,4>((tcu *)&local_25c,&local_26c,&local_28c);
  tcu::computeFixedPointThreshold(local_24c,&local_25c);
  lookupPrec.uvwBits.m_data._4_8_ = local_24c;
  lookupPrec.colorThreshold.m_data[0] = local_244[0];
  lookupPrec.colorThreshold.m_data[1] = local_244[1];
  if ((refParams.baseLevel._3_1_ & 1) == 0) {
    tcu::Vector<int,_3>::Vector(&local_298,10);
  }
  else {
    tcu::Vector<int,_3>::Vector(&local_298,8);
  }
  lookupPrec.coordBits.m_data[0] = local_298.m_data[2];
  lodPrec.derivateBits = local_298.m_data[0];
  lodPrec.lodBits = local_298.m_data[1];
  tcu::Vector<int,_3>::Vector((Vector<int,_3> *)&curX_1,5,5,0);
  lookupPrec.coordBits.m_data[1] = curX_1;
  lookupPrec.coordBits.m_data[2] = cellNdx_1;
  lookupPrec.uvwBits.m_data[0] = local_29c;
  local_1fc._4_4_ = 10;
  lodPrec.rule = 6;
  if ((refParams.baseLevel._3_1_ & 1) != 0) {
    lodPrec.rule = RULE_LAST|RULE_VULKAN;
  }
  for (curY_1 = 0;
      sVar5 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::size
                        ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX
                        ), curY_1 < (int)sVar5; curY_1 = curY_1 + 1) {
    pvVar6 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX,
                        (long)curY_1);
    piVar7 = tcu::Vector<int,_4>::x(pvVar6);
    iVar3 = *piVar7;
    pvVar6 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX,
                        (long)curY_1);
    piVar7 = tcu::Vector<int,_4>::y(pvVar6);
    iVar1 = *piVar7;
    pvVar6 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX,
                        (long)curY_1);
    piVar7 = tcu::Vector<int,_4>::z(pvVar6);
    iVar2 = *piVar7;
    pvVar6 = std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::operator[]
                       ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX,
                        (long)curY_1);
    piVar7 = tcu::Vector<int,_4>::w(pvVar6);
    height = *piVar7;
    idealDst._28_4_ = curY_1 % 6;
    glu::TextureTestUtil::computeQuadTexCoordCube
              ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,
               idealDst._28_4_);
    if ((refParams.baseLevel._3_1_ & 1) != 0) {
      refParams.super_RenderParams.texType = refParams.super_RenderParams.texType | TEXTURETYPE_CUBE
      ;
      refParams.super_RenderParams.samplerType =
           (SamplerType)iterate::s_projections[curY_1 % 4].m_data[0];
      refParams.super_RenderParams.flags = (deUint32)iterate::s_projections[curY_1 % 4].m_data[1];
      refParams.super_RenderParams.w.m_data._0_8_ =
           *(undefined8 *)(iterate::s_projections[curY_1 % 4].m_data + 2);
    }
    if ((refParams.baseLevel._2_1_ & 1) != 0) {
      refParams.super_RenderParams.texType =
           refParams.super_RenderParams.texType | TEXTURETYPE_2D_ARRAY;
      refParams.super_RenderParams.w.m_data[2] = iterate::s_bias[curY_1 % 8];
    }
    tcu::SurfaceAccess::SurfaceAccess
              ((SurfaceAccess *)local_2e0,(Surface *)&errorMask.m_pixels.m_cap,
               (PixelFormat *)&referenceFrame.m_pixels.m_cap,iVar3,iVar1,iVar2,height);
    pTVar9 = de::SharedPtr<vkt::pipeline::TestTextureCube>::operator->(&this->m_texture);
    iVar4 = (*(pTVar9->super_TestTexture)._vptr_TestTexture[0x11])();
    tcu::TextureCube::operator_cast_to_TextureCubeView
              (&local_318,(TextureCube *)CONCAT44(extraout_var,iVar4));
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,0);
    glu::TextureTestUtil::sampleTexture
              ((SurfaceAccess *)local_2e0,&local_318,pvVar8,
               (ReferenceParams *)
               &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    tcu::Surface::getAccess(&local_368,(Surface *)local_e8);
    tcu::getSubregion((PixelBufferAccess *)&local_340,&local_368,iVar3,iVar1,iVar2,height);
    tcu::Surface::getAccess(&local_3b8,(Surface *)&errorMask.m_pixels.m_cap);
    tcu::getSubregion((PixelBufferAccess *)&local_390,&local_3b8,iVar3,iVar1,iVar2,height);
    tcu::Surface::getAccess(&local_408,(Surface *)&lookupPrec.colorMask);
    tcu::getSubregion(&local_3e0,&local_408,iVar3,iVar1,iVar2,height);
    pTVar9 = de::SharedPtr<vkt::pipeline::TestTextureCube>::operator->(&this->m_texture);
    iVar3 = (*(pTVar9->super_TestTexture)._vptr_TestTexture[0x11])();
    tcu::TextureCube::operator_cast_to_TextureCubeView
              (&local_440,(TextureCube *)CONCAT44(extraout_var_00,iVar3));
    pvVar8 = std::vector<float,_std::allocator<float>_>::operator[]
                       ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap,0);
    pTVar10 = Context::getTestContext((this->super_TestInstance).m_context);
    watchDog = tcu::TestContext::getWatchDog(pTVar10);
    iVar3 = glu::TextureTestUtil::computeTextureLookupDiff
                      (&local_340,&local_390,&local_3e0,&local_440,pvVar8,
                       (ReferenceParams *)
                       &texCoord.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage,
                       (LookupPrecision *)&lodPrec.derivateBits,(LodPrecision *)local_1fc,watchDog);
    lookupPrec.colorThreshold.m_data[3] = (float)(iVar3 + (int)lookupPrec.colorThreshold.m_data[3]);
  }
  if (0 < (int)lookupPrec.colorThreshold.m_data[3]) {
    pTVar10 = Context::getTestContext((this->super_TestInstance).m_context);
    pTVar11 = tcu::TestContext::getLog(pTVar10);
    tcu::TestLog::operator<<(&local_5c0,pTVar11,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar12 = tcu::MessageBuilder::operator<<
                        (&local_5c0,(char (*) [41])"ERROR: Image verification failed, found ");
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(int *)(lookupPrec.colorThreshold.m_data + 3))
    ;
    pMVar12 = tcu::MessageBuilder::operator<<(pMVar12,(char (*) [17])" invalid pixels!");
    tcu::MessageBuilder::operator<<(pMVar12,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_5c0);
  }
  pTVar10 = Context::getTestContext((this->super_TestInstance).m_context);
  pTVar11 = tcu::TestContext::getLog(pTVar10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_620,"Result",&local_621);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_648,"Verification result",&local_649);
  tcu::LogImageSet::LogImageSet(&local_600,&local_620,&local_648);
  pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_600);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_700,"Rendered",&local_701);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_728,"Rendered image",&local_729);
  tcu::LogImage::LogImage
            (&local_6e0,&local_700,&local_728,(Surface *)local_e8,QP_IMAGE_COMPRESSION_MODE_BEST);
  tcu::TestLog::operator<<(pTVar11,&local_6e0);
  tcu::LogImage::~LogImage(&local_6e0);
  std::__cxx11::string::~string((string *)&local_728);
  std::allocator<char>::~allocator(&local_729);
  std::__cxx11::string::~string((string *)&local_700);
  std::allocator<char>::~allocator(&local_701);
  tcu::LogImageSet::~LogImageSet(&local_600);
  std::__cxx11::string::~string((string *)&local_648);
  std::allocator<char>::~allocator(&local_649);
  std::__cxx11::string::~string((string *)&local_620);
  std::allocator<char>::~allocator(&local_621);
  if (0 < (int)lookupPrec.colorThreshold.m_data[3]) {
    pTVar10 = Context::getTestContext((this->super_TestInstance).m_context);
    pTVar11 = tcu::TestContext::getLog(pTVar10);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_7e0,"Reference",&local_7e1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_808,"Ideal reference",&local_809);
    tcu::LogImage::LogImage
              (&local_7c0,&local_7e0,&local_808,(Surface *)&errorMask.m_pixels.m_cap,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    pTVar11 = tcu::TestLog::operator<<(pTVar11,&local_7c0);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_8c0,"ErrorMask",&local_8c1);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)local_8e8,"Error mask",&local_8e9);
    tcu::LogImage::LogImage
              (&local_8a0,&local_8c0,(string *)local_8e8,(Surface *)&lookupPrec.colorMask,
               QP_IMAGE_COMPRESSION_MODE_BEST);
    tcu::TestLog::operator<<(pTVar11,&local_8a0);
    tcu::LogImage::~LogImage(&local_8a0);
    std::__cxx11::string::~string((string *)local_8e8);
    std::allocator<char>::~allocator(&local_8e9);
    std::__cxx11::string::~string((string *)&local_8c0);
    std::allocator<char>::~allocator(&local_8c1);
    tcu::LogImage::~LogImage(&local_7c0);
    std::__cxx11::string::~string((string *)&local_808);
    std::allocator<char>::~allocator(&local_809);
    std::__cxx11::string::~string((string *)&local_7e0);
    std::allocator<char>::~allocator(&local_7e1);
  }
  pTVar10 = Context::getTestContext((this->super_TestInstance).m_context);
  pTVar11 = tcu::TestContext::getLog(pTVar10);
  tcu::TestLog::operator<<(pTVar11,(EndImageSetToken *)&tcu::TestLog::EndImageSet);
  local_8ea = lookupPrec.colorThreshold.m_data[3] == 0.0;
  local_912 = 0;
  local_913 = 0;
  if ((bool)local_8ea) {
    std::allocator<char>::allocator();
    local_912 = 1;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_910,"pass",&local_911);
    local_913 = 1;
    tcu::TestStatus::pass(__return_storage_ptr__,&local_910);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_938,"fail",&local_939);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_938);
    std::__cxx11::string::~string((string *)&local_938);
    std::allocator<char>::~allocator(&local_939);
  }
  if ((local_913 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_910);
  }
  if ((local_912 & 1) != 0) {
    std::allocator<char>::~allocator(&local_911);
  }
  tcu::Surface::~Surface((Surface *)&lookupPrec.colorMask);
  tcu::Surface::~Surface((Surface *)&errorMask.m_pixels.m_cap);
  std::vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_>::~vector
            ((vector<tcu::Vector<int,_4>,_std::allocator<tcu::Vector<int,_4>_>_> *)&curX);
  tcu::Surface::~Surface((Surface *)local_e8);
  std::vector<float,_std::allocator<float>_>::~vector
            ((vector<float,_std::allocator<float>_> *)&renderedFrame.m_pixels.m_cap);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus TextureCubeMipmapTestInstance::iterate (void)
{
	const int			viewportWidth	= m_renderer.getRenderWidth();
	const int			viewportHeight	= m_renderer.getRenderHeight();

	const bool			isProjected		= m_testParameters.coordType == COORDTYPE_PROJECTED;
	const bool			useLodBias		= m_testParameters.coordType == COORDTYPE_BASIC_BIAS;

	ReferenceParams		refParams		(TEXTURETYPE_CUBE);
	vector<float>		texCoord;
	tcu::Surface		renderedFrame	(viewportWidth, viewportHeight);

	refParams.sampler		= util::createSampler(m_testParameters.wrapS, m_testParameters.wrapT, m_testParameters.minFilter, m_testParameters.magFilter);
	refParams.samplerType	= getSamplerType(vk::mapVkFormat(m_testParameters.format));
	refParams.flags			= (isProjected ? ReferenceParams::PROJECTED : 0) | (useLodBias ? ReferenceParams::USE_BIAS : 0);
	refParams.lodMode		= LODMODE_EXACT; // Use ideal lod.

	// Compute grid.
	vector<IVec4> gridLayout;
	computeGridLayout(gridLayout, viewportWidth, viewportHeight);

	// Bias values.
	static const float s_bias[] = { 1.0f, -2.0f, 0.8f, -0.5f, 1.5f, 0.9f, 2.0f, 4.0f };

	// Projection values \note Less agressive than in 2D case due to smaller quads.
	static const Vec4 s_projections[] =
	{
		Vec4(1.2f, 1.0f, 0.7f, 1.0f),
		Vec4(1.3f, 0.8f, 0.6f, 1.1f),
		Vec4(0.8f, 1.0f, 1.2f, 0.8f),
		Vec4(1.2f, 1.0f, 1.3f, 0.9f)
	};

	// Render with GL
	for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
	{
		const float			curX		= (float)gridLayout[cellNdx].x();
		const float			curY		= (float)gridLayout[cellNdx].y();
		const float			curW		= (float)gridLayout[cellNdx].z();
		const float			curH		= (float)gridLayout[cellNdx].w();
		const tcu::CubeFace	cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);

		DE_ASSERT(m_testParameters.coordType != COORDTYPE_AFFINE); // Not supported.
		computeQuadTexCoordCube(texCoord, cubeFace);

		if (isProjected)
		{
			refParams.flags	|= ReferenceParams::PROJECTED;
			refParams.w		 = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];
		}

		if (useLodBias)
		{
			refParams.flags	|= ReferenceParams::USE_BIAS;
			refParams.bias	 = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];
		}

		// Render
		m_renderer.setViewport(curX, curY, curW, curH);
		m_renderer.renderQuad(renderedFrame, 0, &texCoord[0], refParams);
	}

	// Render reference and compare
	{
		const tcu::IVec4		formatBitDepth		= getTextureFormatBitDepth(vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM));
		const tcu::PixelFormat	pixelFormat			(formatBitDepth[0], formatBitDepth[1], formatBitDepth[2], formatBitDepth[3]);
		tcu::Surface			referenceFrame		(viewportWidth, viewportHeight);
		tcu::Surface			errorMask			(viewportWidth, viewportHeight);
		int						numFailedPixels		= 0;
		tcu::LookupPrecision	lookupPrec;
		tcu::LodPrecision		lodPrec				(tcu::LodPrecision::RULE_VULKAN);

		// Params for rendering reference
		refParams.sampler					= util::createSampler(m_testParameters.wrapS, m_testParameters.wrapT, m_testParameters.minFilter, m_testParameters.magFilter);
		refParams.sampler.seamlessCubeMap	= true;
		refParams.lodMode					= LODMODE_EXACT;

		// Comparison parameters
		lookupPrec.colorMask		= getCompareMask(pixelFormat);
		lookupPrec.colorThreshold	= tcu::computeFixedPointThreshold(max(getBitsVec(pixelFormat)-2, tcu::IVec4(0)));
		lookupPrec.coordBits		= isProjected ? tcu::IVec3(8) : tcu::IVec3(10);
		lookupPrec.uvwBits			= tcu::IVec3(5,5,0);
		lodPrec.derivateBits		= 10;
		lodPrec.lodBits				= isProjected ? 3 : 6;

		for (int cellNdx = 0; cellNdx < (int)gridLayout.size(); cellNdx++)
		{
			const int				curX		= gridLayout[cellNdx].x();
			const int				curY		= gridLayout[cellNdx].y();
			const int				curW		= gridLayout[cellNdx].z();
			const int				curH		= gridLayout[cellNdx].w();
			const tcu::CubeFace		cubeFace	= (tcu::CubeFace)(cellNdx % tcu::CUBEFACE_LAST);

			DE_ASSERT(m_testParameters.coordType != COORDTYPE_AFFINE); // Not supported.
			computeQuadTexCoordCube(texCoord, cubeFace);

			if (isProjected)
			{
				refParams.flags	|= ReferenceParams::PROJECTED;
				refParams.w		 = s_projections[cellNdx % DE_LENGTH_OF_ARRAY(s_projections)];
			}

			if (useLodBias)
			{
				refParams.flags	|= ReferenceParams::USE_BIAS;
				refParams.bias	 = s_bias[cellNdx % DE_LENGTH_OF_ARRAY(s_bias)];
			}

			// Render ideal reference.
			{
				tcu::SurfaceAccess idealDst(referenceFrame, pixelFormat, curX, curY, curW, curH);
				sampleTexture(idealDst, m_texture->getTexture(), &texCoord[0], refParams);
			}

			// Compare this cell
			numFailedPixels += computeTextureLookupDiff(tcu::getSubregion(renderedFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(referenceFrame.getAccess(), curX, curY, curW, curH),
														tcu::getSubregion(errorMask.getAccess(), curX, curY, curW, curH),
														m_texture->getTexture(), &texCoord[0], refParams,
														lookupPrec, lodPrec, m_context.getTestContext().getWatchDog());
		}

		if (numFailedPixels > 0)
		{
			m_context.getTestContext().getLog() << TestLog::Message << "ERROR: Image verification failed, found " << numFailedPixels << " invalid pixels!" << TestLog::EndMessage;
		}

		m_context.getTestContext().getLog() << TestLog::ImageSet("Result", "Verification result")
											<< TestLog::Image("Rendered", "Rendered image", renderedFrame);

		if (numFailedPixels > 0)
		{
			m_context.getTestContext().getLog() << TestLog::Image("Reference", "Ideal reference", referenceFrame)
												<< TestLog::Image("ErrorMask", "Error mask", errorMask);
		}

		m_context.getTestContext().getLog() << TestLog::EndImageSet;

		{
			const bool isOk = numFailedPixels == 0;
			return isOk ? tcu::TestStatus::pass("pass") : tcu::TestStatus::fail("fail");
		}
	}
}